

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O2

void ctemplate_htmlparser::exit_attr(statemachine_ctx *ctx,int start,char chr,int end)

{
  char *src;
  undefined4 in_register_0000000c;
  size_t src_size;
  char *dst;
  
  src_size = CONCAT44(in_register_0000000c,end);
  if (ctx->user != (void *)0x0) {
    dst = (char *)((long)ctx->user + 0x128);
    src = statemachine_stop_record(ctx);
    nopad_strncpy(dst,src,ctx->record_pos + 1,src_size);
    tolower_str(dst);
    return;
  }
  __assert_fail("html != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/htmlparser.cc"
                ,0x1f2,"void ctemplate_htmlparser::exit_attr(statemachine_ctx *, int, char, int)");
}

Assistant:

static void exit_attr(statemachine_ctx *ctx, int start, char chr, int end)
{
    htmlparser_ctx *html = CAST(htmlparser_ctx *, ctx->user);
    assert(html != NULL);

    nopad_strncpy(html->attr, statemachine_stop_record(ctx),
                  HTMLPARSER_MAX_STRING, statemachine_record_length(ctx));

    tolower_str(html->attr);
}